

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O1

err_t TextWrite(textwriter *p,tchar_t *Msg)

{
  stream *psVar1;
  size_t sVar2;
  err_t eVar3;
  char s [1024];
  char acStack_418 [1032];
  
  CharConvSS(p->CC,acStack_418,0x400,Msg);
  psVar1 = p->Stream;
  if (psVar1 != (stream *)0x0) {
    sVar2 = strlen(acStack_418);
    eVar3 = (**(code **)((long)(psVar1->Base).VMT + 0x70))(psVar1,acStack_418,sVar2,0);
    return eVar3;
  }
  __assert_fail("(const void*)(p->Stream)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/parser2.c"
                ,0x124,"err_t TextWrite(textwriter *, const tchar_t *)");
}

Assistant:

err_t TextWrite(textwriter* p, const tchar_t* Msg)
{
    size_t i;
    char s[MAXLINE];
    CharConvST(p->CC,s,sizeof(s),Msg);

    i = strlen(s);

#if defined(TARGET_WIN)
    {
        char* nl = s;
        while (i+1<sizeof(s) && (nl = strchr(nl,10))!=NULL)
        {
            memmove(nl+1,nl,i+1-(nl-s));
            *nl = 13;
            nl += 2;
            ++i;
        }
    }
#endif

    return Stream_Write(p->Stream,s,i,NULL);
}